

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::unary_op_asin>(Mat *a,Option *opt)

{
  int iVar1;
  long *in_RDI;
  float fVar2;
  int i;
  int size;
  unary_op_asin op;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffc4;
  
  iVar1 = (int)in_RDI[8] * (int)in_RDI[7];
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    fVar2 = unary_op_asin::operator()
                      ((unary_op_asin *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),
                       (float *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
    *(float *)(*in_RDI + (long)iVar3 * 4) = fVar2;
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int size = static_cast<int>(a.total());

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < size; i++)
    {
        a[i] = op(a[i]);
    }

    return 0;
}